

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_matching
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  _Alloc_hider _Var1;
  bool bVar2;
  ContextType ctxType;
  GLuint shader;
  GLuint program;
  GLuint shader_00;
  char *__s;
  SsboArgs *in_RCX;
  SsboArgs *args;
  TestLog *in_R8;
  TestLog *log;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  string shaderFragmentString;
  string message;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  GLint linkStatus;
  string shaderVertexString;
  char *shaderFragmentCharPtr;
  char *shaderVertexCharPtr;
  string versionString;
  SsboArgData argDataArrayFrag [8];
  SsboArgs ssboArgs;
  string local_5c8;
  char *local_5a8;
  long local_5a0;
  char local_598;
  undefined7 uStack_597;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_588;
  string local_580;
  ArgMember local_560 [8];
  string local_540;
  char *local_520;
  undefined8 local_518;
  char local_510;
  undefined7 uStack_50f;
  string local_500;
  undefined1 local_4e0 [8];
  _Alloc_hider local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  ulong local_4b8;
  undefined1 local_4b0 [8];
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  char *local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8 [6];
  ios_base local_390 [264];
  SsboArgData local_288;
  SsboArgData local_260;
  SsboArgData local_238;
  SsboArgData local_210;
  SsboArgData local_1e8;
  SsboArgData local_1c0;
  SsboArgData local_198;
  SsboArgData local_170;
  undefined1 local_148 [280];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_588 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ctx->super_CallLogWrapper).m_log;
  local_5a8 = &local_598;
  local_5a0 = 0;
  local_598 = '\0';
  __s = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,__s,(allocator<char> *)local_408);
  local_448._M_dataplus._M_p = local_4b0 + 0x78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4b0 + 0x68),local_428,local_428 + local_420._M_allocated_capacity);
  anon_unknown_0::args::SsboArgs::SsboArgs
            ((SsboArgs *)(local_148 + 8),(string *)(local_4b0 + 0x68),
             (TestLog *)&local_588->_M_allocated_capacity);
  if (local_448._M_dataplus._M_p != local_4b0 + 0x78) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_520 = &local_510;
  local_518 = 0;
  local_510 = '\0';
  local_560[7] = 0;
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"std140","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_288,local_560 + 7,(string *)local_408);
  local_560[6] = 1;
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"10","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_260,local_560 + 6,&local_5c8);
  local_560[5] = 2;
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"row_major","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_238,local_560 + 5,&local_580);
  local_560[4] = 3;
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"vec2","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_210,local_560 + 4,&local_500);
  local_560[3] = 4;
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"name_changed","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_1e8,local_560 + 3,&local_540);
  local_560[2] = 5;
  local_468._M_dataplus._M_p = local_4b0 + 0x58;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_4b0 + 0x48),"20","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            (&local_1c0,local_560 + 2,(string *)(local_4b0 + 0x48));
  local_560[1] = 6;
  local_488._M_dataplus._M_p = local_4b0 + 0x38;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_4b0 + 0x28),"5","");
  anon_unknown_0::args::SsboArgData::SsboArgData
            (&local_198,local_560 + 1,(string *)(local_4b0 + 0x28));
  local_560[0] = ARGMEMBER_REORDER;
  local_4a8._M_dataplus._M_p = local_4b0 + 0x18;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_4b0 + 8),"true","");
  anon_unknown_0::args::SsboArgData::SsboArgData(&local_170,local_560,(string *)(local_4b0 + 8));
  if (local_4a8._M_dataplus._M_p != local_4b0 + 0x18) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if (local_488._M_dataplus._M_p != local_4b0 + 0x38) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if (local_468._M_dataplus._M_p != local_4b0 + 0x58) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,
                    CONCAT71(local_5c8.field_2._M_allocated_capacity._1_7_,
                             local_5c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&local_580,&local_288,(SsboArgData *)local_148,(allocator_type *)in_RCX);
  NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
            ((string *)local_408,(_anonymous_namespace_ *)0x8b31,(int)local_148 + 8,in_RCX,in_R8);
  std::__cxx11::string::operator=((string *)&local_520,(string *)local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
  }
  local_4b0 = (undefined1  [8])local_520;
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  std::__cxx11::string::_M_assign((string *)&local_5a8);
  this = (ostringstream *)(local_408 + 8);
  local_408._0_8_ = local_588;
  std::__cxx11::ostringstream::ostringstream(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_5a8,local_5a0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_390);
  args = (SsboArgs *)local_4b0;
  log = (TestLog *)0x0;
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,shader,1,(GLchar **)args,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader);
  if ((pointer)local_580._M_string_length != local_580._M_dataplus._M_p) {
    lVar5 = 0x10;
    uVar3 = 0;
    do {
      _Var1._M_p = local_580._M_dataplus._M_p;
      local_540._M_dataplus._M_p._0_4_ = 0xffffffff;
      local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
      local_5c8._M_string_length = 0;
      local_5c8.field_2._M_local_buf[0] = '\0';
      local_408._0_8_ = local_3f8;
      local_4b8 = uVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,
                 "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
                 ,"");
      NegativeTestContext::beginSection(ctx,(string *)local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != local_3f8) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
      anon_unknown_0::args::SsboArgs::setDefaultValues((SsboArgs *)(local_148 + 8));
      local_4e0._0_4_ = *(undefined4 *)(_Var1._M_p + lVar5 + -0x10);
      local_4d8._M_p = (pointer)&local_4c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d8,*(long *)(_Var1._M_p + lVar5 + -8),
                 *(long *)(_Var1._M_p + lVar5) + *(long *)(_Var1._M_p + lVar5 + -8));
      anon_unknown_0::args::SsboArgs::setSingleValue
                ((SsboArgs *)(local_148 + 8),(SsboArgData *)local_4e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_p != &local_4c8) {
        operator_delete(local_4d8._M_p,local_4c8._M_allocated_capacity + 1);
      }
      NegativeTestShared::(anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
                ((string *)local_408,(_anonymous_namespace_ *)0x8b30,(int)local_148 + 8,args,log);
      std::__cxx11::string::operator=((string *)&local_5c8,(string *)local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != local_3f8) {
        operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
      }
      local_500._M_dataplus._M_p = local_5c8._M_dataplus._M_p;
      shader_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
      std::__cxx11::string::_M_assign((string *)&local_5a8);
      local_408._0_8_ = local_588;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_408 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_408 + 8),local_5a8,local_5a0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_408 + 8));
      std::ios_base::~ios_base(local_390);
      log = (TestLog *)0x0;
      glu::CallLogWrapper::glShaderSource
                (&ctx->super_CallLogWrapper,shader_00,1,(GLchar **)&local_500,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader_00);
      glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader);
      glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader_00);
      glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program);
      glu::CallLogWrapper::glGetProgramiv
                (&ctx->super_CallLogWrapper,program,0x8b82,(GLint *)&local_540);
      logProgramInfo(ctx,program);
      if ((int)local_540._M_dataplus._M_p == 1) {
        local_408._0_8_ = local_3f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,"Program should not have linked","");
        NegativeTestContext::fail(ctx,(string *)local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._0_8_ != local_3f8) {
          operator_delete((void *)local_408._0_8_,local_3f8[0]._M_allocated_capacity + 1);
        }
      }
      glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader_00);
      glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
      NegativeTestContext::endSection(ctx);
      uVar3 = local_4b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p,
                        CONCAT71(local_5c8.field_2._M_allocated_capacity._1_7_,
                                 local_5c8.field_2._M_local_buf[0]) + 1);
      }
      uVar3 = uVar3 + 1;
      args = (SsboArgs *)0xcccccccccccccccd;
      lVar5 = lVar5 + 0x28;
    } while (uVar3 < (ulong)(((long)(local_580._M_string_length - (long)local_580._M_dataplus._M_p)
                             >> 3) * -0x3333333333333333));
  }
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
             *)&local_580);
  lVar5 = -0x140;
  paVar4 = &local_170.data.field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -5);
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0);
  if (local_520 != &local_510) {
    operator_delete(local_520,CONCAT71(uStack_50f,local_510) + 1);
  }
  anon_unknown_0::args::SsboArgs::~SsboArgs((SsboArgs *)(local_148 + 8));
  if (local_428 != local_420._M_local_buf + 8) {
    operator_delete(local_428,local_420._8_8_ + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
  }
  return;
}

Assistant:

void ssbo_block_matching(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// List of arguments used to create varying ssbo objects in the fragment shader
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"std140"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"10"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_MEMBER_TYPE,		"vec2"),
													args::SsboArgData(args::ARGMEMBER_NAME,				"name_changed"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"5"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"true") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); ++idx)
	{
		GLint			linkStatus				=	-1;
		GLint			program;
		GLint			shaderFragmentGL;
		std::string		shaderFragmentString;
		const char*		shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.resetValues();
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}